

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

int __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetEnumValue
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  int default_value;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  EnumValueDescriptor *this_01;
  int *piVar5;
  int local_24;
  int32 value;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetEnumValue","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetEnumValue",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetEnumValue",CPPTYPE_ENUM);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = GetExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    this_01 = FieldDescriptor::default_value_enum(field);
    default_value = EnumValueDescriptor::number(this_01);
    local_24 = ExtensionSet::GetEnum(this_00,number,default_value);
  }
  else {
    piVar5 = GetField<int>(this,message,field);
    local_24 = *piVar5;
  }
  return local_24;
}

Assistant:

int GeneratedMessageReflection::GetEnumValue(
    const Message& message, const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetEnumValue, SINGULAR, ENUM);

  int32 value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetEnum(
      field->number(), field->default_value_enum()->number());
  } else {
    value = GetField<int>(message, field);
  }
  return value;
}